

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall
cmFileAPI::BuildCache(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  char *value;
  Value *pVVar1;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value *local_68;
  Value *version;
  Value local_50;
  undefined1 local_21;
  Object *local_20;
  Object *object_local;
  cmFileAPI *this_local;
  Value *cache;
  
  local_21 = 0;
  local_20 = object;
  object_local = (Object *)this;
  this_local = (cmFileAPI *)__return_storage_ptr__;
  cmFileAPICacheDump(__return_storage_ptr__,this,object->Version);
  value = ObjectKindName(local_20->Kind);
  Json::Value::Value(&local_50,value);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"kind");
  Json::Value::operator=(pVVar1,&local_50);
  Json::Value::~Value(&local_50);
  Json::Value::Value(&local_90,objectValue);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"version");
  pVVar1 = Json::Value::operator=(pVVar1,&local_90);
  Json::Value::~Value(&local_90);
  if (local_20->Version == 2) {
    local_68 = pVVar1;
    Json::Value::Value(&local_b8,2);
    pVVar1 = Json::Value::operator[](local_68,"major");
    Json::Value::operator=(pVVar1,&local_b8);
    Json::Value::~Value(&local_b8);
    Json::Value::Value(&local_e0,0);
    pVVar1 = Json::Value::operator[](local_68,"minor");
    Json::Value::operator=(pVVar1,&local_e0);
    Json::Value::~Value(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildCache(Object const& object)
{
  using namespace std::placeholders;
  Json::Value cache = cmFileAPICacheDump(*this, object.Version);
  cache["kind"] = this->ObjectKindName(object.Kind);

  Json::Value& version = cache["version"] = Json::objectValue;
  if (object.Version == 2) {
    version["major"] = 2;
    version["minor"] = CacheV2Minor;
  } else {
    return cache; // should be unreachable
  }

  return cache;
}